

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int add_option(archive_read *a,mtree_option **global,char *value,size_t len)

{
  undefined8 *__ptr;
  uint *puVar1;
  void *pvVar2;
  size_t in_RCX;
  void *in_RDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  mtree_option *opt;
  int local_4;
  
  __ptr = (undefined8 *)malloc(0x10);
  if (__ptr == (undefined8 *)0x0) {
    puVar1 = (uint *)__errno_location();
    archive_set_error(in_RDI,(int)(ulong)*puVar1,"Can\'t allocate memory");
    local_4 = -0x1e;
  }
  else {
    pvVar2 = malloc(in_RCX + 1);
    __ptr[1] = pvVar2;
    if (pvVar2 == (void *)0x0) {
      free(__ptr);
      puVar1 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar1,"Can\'t allocate memory");
      local_4 = -0x1e;
    }
    else {
      memcpy((void *)__ptr[1],in_RDX,in_RCX);
      *(undefined1 *)(__ptr[1] + in_RCX) = 0;
      *__ptr = *in_RSI;
      *in_RSI = __ptr;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
add_option(struct archive_read *a, struct mtree_option **global,
    const char *value, size_t len)
{
	struct mtree_option *opt;

	if ((opt = malloc(sizeof(*opt))) == NULL) {
		archive_set_error(&a->archive, errno, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	if ((opt->value = malloc(len + 1)) == NULL) {
		free(opt);
		archive_set_error(&a->archive, errno, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	memcpy(opt->value, value, len);
	opt->value[len] = '\0';
	opt->next = *global;
	*global = opt;
	return (ARCHIVE_OK);
}